

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::resume_state_machine_execution(raft_server *this)

{
  element_type *peVar1;
  int iVar2;
  nuraft_global_mgr *this_00;
  char *pcVar3;
  char *pcVar4;
  ptr<raft_server> pStack_48;
  unique_lock<std::mutex> l;
  
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pcVar4 = "ACTIVE";
      if (((this->sm_commit_paused_)._M_base._M_i & 1U) != 0) {
        pcVar4 = "PAUSED";
      }
      pcVar3 = "SLEEPING";
      if (((this->sm_commit_exec_in_progress_)._M_base._M_i & 1U) != 0) {
        pcVar3 = "RUNNING";
      }
      msg_if_given_abi_cxx11_
                ((string *)&l,"resume state machine execution, previously %s, state machine %s",
                 pcVar4,pcVar3);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"resume_state_machine_execution",0x386,(string *)&l);
      std::__cxx11::string::~string((string *)&l);
    }
  }
  LOCK();
  (this->sm_commit_paused_)._M_base._M_i = false;
  UNLOCK();
  this_00 = nuraft_global_mgr::get_instance();
  if (this_00 == (nuraft_global_mgr *)0x0) {
    std::unique_lock<std::mutex>::unique_lock(&l,&this->commit_cv_lock_);
    std::condition_variable::notify_one();
    std::unique_lock<std::mutex>::~unique_lock(&l);
  }
  else {
    std::__shared_ptr<nuraft::raft_server,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<nuraft::raft_server,void>
              ((__shared_ptr<nuraft::raft_server,(__gnu_cxx::_Lock_policy)2> *)&pStack_48,
               (__weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<nuraft::raft_server>);
    nuraft_global_mgr::request_commit(this_00,&pStack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pStack_48.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void raft_server::resume_state_machine_execution() {
    p_in( "resume state machine execution, previously %s, state machine %s",
          sm_commit_paused_ ? "PAUSED" : "ACTIVE",
          sm_commit_exec_in_progress_ ? "RUNNING" : "SLEEPING" );
    sm_commit_paused_ = false;

    nuraft_global_mgr* mgr = nuraft_global_mgr::get_instance();
    if (mgr) {
        // Global mgr.
        mgr->request_commit( this->shared_from_this() );
    } else {
        // Local commit thread.
        std::unique_lock<std::mutex> l(commit_cv_lock_);
        commit_cv_.notify_one();
    }
}